

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

DynamicType * __thiscall
Js::PathTypeHandlerBase::PromoteType<true>
          (PathTypeHandlerBase *this,DynamicType *predecessorType,PathTypeSuccessorKey key,
          bool shareType,ScriptContext *scriptContext,DynamicObject *instance,
          PropertyIndex *propertyIndex)

{
  Type *pTVar1;
  int *piVar2;
  ushort uVar3;
  JavascriptLibrary *pJVar4;
  PathTypeSuccessorInfo *this_00;
  Data *pDVar5;
  TypePath *pTVar6;
  RecyclerWeakReference<Js::DynamicObject> *pRVar7;
  DynamicType *pDVar8;
  code *pcVar9;
  undefined1 auVar10 [8];
  RecyclerWeakReference<Js::DynamicType> *successorKey;
  TypePath *pTVar11;
  Recycler *pRVar12;
  uint8 oldPathSize;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  byte bVar16;
  PropertyTypes PVar17;
  PropertyIndex PVar18;
  int iVar19;
  PropertyId propertyId;
  undefined4 *puVar20;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypePath *pTVar21;
  PathTypeSetterSlotIndex *oldSetters;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PathTypeHandlerBase *pPVar22;
  undefined6 extraout_var;
  Recycler *alloc;
  PathTypeHandlerWithAttr *pPVar23;
  RecyclerWeakReferenceBase *weakRef;
  byte bVar24;
  undefined7 in_register_00000009;
  uint uVar25;
  ushort uVar26;
  uint uVar27;
  char16_t *this_01;
  PathTypeHandlerWithAttr *pPVar28;
  PathTypeHandlerBase *this_02;
  char *this_03;
  char cVar29;
  ScriptContext *pSVar30;
  undefined1 local_f0 [8];
  TrackAllocData data;
  RecyclerWeakReference<Js::DynamicType> *local_b0;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  DynamicType *local_a0;
  ulong local_98;
  ScriptContext *local_90;
  TypePath *local_88;
  undefined4 local_7c;
  PathTypeHandlerBase *local_78;
  PropertyRecord *local_70;
  Recycler *local_68;
  uint local_5c;
  DynamicObject *local_58;
  PathTypeSetterSlotIndex *local_50;
  uint16 local_42;
  undefined8 local_40;
  PathTypeHandlerWithAttr *local_38;
  
  local_7c = (undefined4)CONCAT71(in_register_00000009,shareType);
  nextTypeWeakRef = (RecyclerWeakReference<Js::DynamicType> *)key;
  local_58 = instance;
  if (propertyIndex == (PropertyIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x7d1,"(propertyIndex != nullptr)","propertyIndex != nullptr");
    if (!bVar13) goto LAB_00dda3bb;
    *puVar20 = 0;
  }
  successorKey = nextTypeWeakRef;
  local_98 = (ulong)nextTypeWeakRef >> 0x20;
  pJVar4 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  local_68 = scriptContext->recycler;
  local_b0 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
  local_70 = ScriptContext::GetPropertyName(scriptContext,(PropertyId)nextTypeWeakRef);
  this_00 = (this->successorInfo).ptr;
  local_90 = scriptContext;
  if (this_00 == (PathTypeSuccessorInfo *)0x0) {
    local_b0 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
LAB_00dd981b:
    pTVar21 = (this->typePath).ptr;
    local_50 = (PathTypeSetterSlotIndex *)CONCAT71(local_50._1_7_,((pTVar21->data).ptr)->pathSize);
    local_a0 = predecessorType;
    iVar19 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
    local_38 = (PathTypeHandlerWithAttr *)CONCAT44(extraout_var_00,iVar19);
    iVar19 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
    oldSetters = (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_01,iVar19);
    pDVar5 = (((this->typePath).ptr)->data).ptr;
    bVar15 = pDVar5->pathLength;
    uVar26 = (this->super_DynamicTypeHandler).unusedBytes >> 1;
    if (uVar26 < bVar15) {
      this_01 = L"branching";
      local_40 = (PathTypeHandlerWithAttr *)((ulong)local_40._4_4_ << 0x20);
    }
    else {
      local_40 = (PathTypeHandlerWithAttr *)
                 CONCAT44(local_40._4_4_,
                          (int)CONCAT71((int7)((ulong)pDVar5 >> 8),bVar15 == pDVar5->pathSize));
      this_01 = L"advancing";
    }
    local_88 = pTVar21;
    local_78 = this;
    bVar13 = HasSingletonInstance(this);
    if (bVar13) {
      data._32_8_ = (((this->typePath).ptr)->singletonInstance).ptr;
    }
    else {
      data._32_8_ = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
    TraceFixedFieldsBeforeTypeHandlerChange
              (this_01,L"PathTypeHandler",L"PathTypeHandler",local_58,
               &this->super_DynamicTypeHandler,local_a0,
               (RecyclerWeakReference<Js::DynamicObject> *)data._32_8_);
    pPVar28 = local_38;
    pRVar12 = local_68;
    pPVar22 = local_78;
    pTVar21 = local_88;
    cVar29 = (char)local_98;
    if (uVar26 < bVar15) {
      uVar25 = (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1);
      bVar13 = (bool)((DAT_015d6345 ^ 1) & ((this->super_DynamicTypeHandler).flags & 0x18) != 0);
      pPVar22 = (PathTypeHandlerBase *)(this->typePath).ptr;
      if (oldSetters == (PathTypeSetterSlotIndex *)0x0) {
        pTVar21 = TypePath::Branch<false>
                            ((TypePath *)pPVar22,local_68,uVar25,bVar13,(ObjectSlotAttributes *)0x0)
        ;
        pPVar28 = local_38;
      }
      else {
        pTVar21 = TypePath::Branch<true>
                            ((TypePath *)pPVar22,local_68,uVar25,bVar13,
                             (ObjectSlotAttributes *)local_38);
      }
      local_90->branchCount = local_90->branchCount + 1;
      local_90->objectLiteralBranchCount = local_90->objectLiteralBranchCount + 1;
      if (cVar29 == '\a' && pPVar28 == (PathTypeHandlerWithAttr *)0x0) {
        local_40 = (PathTypeHandlerWithAttr *)0x0;
      }
      else {
        local_40 = (PathTypeHandlerWithAttr *)
                   UpdateAttributes(pPVar22,local_68,(ObjectSlotAttributes *)pPVar28,(uint8)local_50
                                    ,((pTVar21->data).ptr)->pathSize);
      }
      if (cVar29 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
        local_50 = UpdateSetterSlots(this,local_68,oldSetters,(uint8)local_50,
                                     ((pTVar21->data).ptr)->pathSize);
      }
      else {
        local_50 = (PathTypeSetterSlotIndex *)0x0;
      }
      pPVar22 = this;
      oldSetters = local_50;
      if (DAT_015d6361 == 1) {
        bVar13 = DynamicTypeHandler::ShouldFixAnyProperties();
        if ((!bVar13) &&
           ((((this->typePath).ptr)->singletonInstance).ptr !=
            (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                       ,0x816,"(this->HasSingletonInstanceOnlyIfNeeded())",
                                       "this->HasSingletonInstanceOnlyIfNeeded()");
          if (!bVar13) goto LAB_00dda3bb;
          *puVar20 = 0;
        }
        pTVar6 = (this->typePath).ptr;
        pRVar7 = (pTVar6->singletonInstance).ptr;
        oldSetters = local_50;
        if ((pRVar7 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
           ((DynamicObject *)(pRVar7->super_RecyclerWeakReferenceBase).strongRef == local_58)) {
          (pTVar6->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
        }
      }
    }
    else if ((char)local_40 == '\0') {
      oldPathSize = (uint8)local_50;
      local_40 = local_38;
      if (local_38 == (PathTypeHandlerWithAttr *)0x0 && cVar29 != '\a') {
        local_40 = (PathTypeHandlerWithAttr *)
                   UpdateAttributes((PathTypeHandlerBase *)this_01,local_68,
                                    (ObjectSlotAttributes *)0x0,(uint8)local_50,
                                    ((local_88->data).ptr)->pathSize);
      }
      if (oldSetters == (PathTypeSetterSlotIndex *)0x0 && cVar29 == -9) {
        oldSetters = UpdateSetterSlots(pPVar22,local_68,(PathTypeSetterSlotIndex *)0x0,oldPathSize,
                                       ((pTVar21->data).ptr)->pathSize);
      }
    }
    else {
      this_02 = (PathTypeHandlerBase *)(local_78->typePath).ptr;
      pTVar21 = TypePath::Grow((TypePath *)this_02,local_68);
      if (cVar29 == '\a' && local_38 == (PathTypeHandlerWithAttr *)0x0) {
        local_40 = (PathTypeHandlerWithAttr *)0x0;
      }
      else {
        local_40 = (PathTypeHandlerWithAttr *)
                   UpdateAttributes(this_02,pRVar12,(ObjectSlotAttributes *)local_38,(uint8)local_50
                                    ,((pTVar21->data).ptr)->pathSize);
      }
      if (cVar29 == -9 || oldSetters != (PathTypeSetterSlotIndex *)0x0) {
        local_50 = UpdateSetterSlots(pPVar22,pRVar12,oldSetters,(uint8)local_50,
                                     ((pTVar21->data).ptr)->pathSize);
      }
      else {
        local_50 = (PathTypeSetterSlotIndex *)0x0;
      }
      pPVar28 = local_38;
      pTVar6 = (pPVar22->typePath).ptr;
      local_88 = (TypePath *)__tls_get_addr(&PTR_0155fe48);
      do {
        (*(pPVar22->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6a])(pPVar22,pTVar21);
        if ((pPVar28 != (PathTypeHandlerWithAttr *)0x0) &&
           (iVar19 = (*(pPVar22->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(pPVar22),
           (PathTypeHandlerWithAttr *)CONCAT44(extraout_var_02,iVar19) == pPVar28)) {
          (*(pPVar22->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6d])(pPVar22,local_40);
        }
        if ((oldSetters != (PathTypeSetterSlotIndex *)0x0) &&
           (iVar19 = (*(pPVar22->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(pPVar22),
           (PathTypeSetterSlotIndex *)CONCAT44(extraout_var_03,iVar19) == oldSetters)) {
          (*(pPVar22->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x72])(pPVar22,local_50);
        }
        pDVar8 = (pPVar22->predecessorType).ptr;
        if (pDVar8 == (DynamicType *)0x0) {
          bVar13 = false;
        }
        else {
          iVar19 = (*((pDVar8->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])();
          if (iVar19 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pTVar11 = local_88;
            *(undefined4 *)&(local_88->data).ptr = 1;
            bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                         ,0x844,
                                         "(currPredecessorType->GetTypeHandler()->IsPathTypeHandler())"
                                         ,
                                         "currPredecessorType->GetTypeHandler()->IsPathTypeHandler()"
                                        );
            if (!bVar13) goto LAB_00dda3bb;
            *(undefined4 *)&(pTVar11->data).ptr = 0;
          }
          pPVar22 = FromTypeHandler((pDVar8->typeHandler).ptr);
          bVar13 = (pPVar22->typePath).ptr == pTVar6;
        }
        pPVar28 = local_38;
      } while (bVar13);
      cVar29 = (char)local_98;
      pPVar22 = local_78;
      oldSetters = local_50;
    }
    local_50 = oldSetters;
    if (cVar29 == -9) {
      iVar19 = TypePath::AddInternal<false>(pTVar21,local_70);
    }
    else {
      iVar19 = TypePath::AddInternal<true>(pTVar21,local_70);
    }
    local_58 = (DynamicObject *)CONCAT44(local_58._4_4_,iVar19);
    uVar27 = ((pPVar22->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    uVar25 = (pPVar22->super_DynamicTypeHandler).slotCapacity;
    uVar26 = (ushort)uVar27;
    if (uVar26 <= (ushort)uVar25) {
      uVar27 = uVar25;
    }
    uVar3 = (pPVar22->super_DynamicTypeHandler).inlineSlotCapacity;
    local_42 = (pPVar22->super_DynamicTypeHandler).offsetOfInlineSlots;
    bVar13 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler
                       (&pPVar22->super_DynamicTypeHandler);
    local_5c = (uint)uVar3;
    if ((bVar13) && ((pPVar22->super_DynamicTypeHandler).slotCapacity < (int)(uVar27 & 0xffff))) {
      PVar18 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      local_5c = local_5c - (int)CONCAT62(extraout_var,PVar18);
      local_42 = 0x20;
    }
    pSVar30 = local_90;
    bVar13 = (bool)(DAT_015d6361 ^ 1 | (byte)local_7c);
    cVar29 = (char)local_98;
    local_88 = pTVar21;
    if (local_38 == (PathTypeHandlerWithAttr *)0x0 && cVar29 == '\a') {
      local_38 = (PathTypeHandlerWithAttr *)
                 PathTypeHandlerNoAttr::New
                           (local_90,pTVar21,uVar26,(PropertyIndex)uVar27,(uint16)local_5c,local_42,
                            true,bVar13,local_a0);
    }
    else {
      iVar19 = (*(local_78->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
      pSVar30 = local_90;
      *(char *)((long)&(local_40->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                       super_DynamicTypeHandler._vptr_DynamicTypeHandler +
               ((ulong)local_58 & 0xffff)) = cVar29;
      local_38 = PathTypeHandlerWithAttr::New
                           (local_90,local_88,(ObjectSlotAttributes *)local_40,local_50,
                            (char)iVar19 + (cVar29 == -9),uVar26,(PropertyIndex)uVar27,
                            (uint16)local_5c,local_42,true,bVar13,local_a0);
    }
    uVar25 = (uint)nextTypeWeakRef;
    if (bVar13 == false) {
      DynamicTypeHandler::SetFlags((DynamicTypeHandler *)local_38,'\b');
    }
    bVar15 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)local_38);
    this_03 = (char *)local_78;
    if ((bVar15 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x87e,"(nextPath->GetHasOnlyWritableDataProperties())",
                                   "nextPath->GetHasOnlyWritableDataProperties()");
      if (!bVar14) goto LAB_00dda3bb;
      *puVar20 = 0;
      uVar25 = (uint)nextTypeWeakRef;
    }
    PVar17 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this_03);
    pPVar28 = local_38;
    DynamicTypeHandler::CopyPropertyTypes((DynamicTypeHandler *)local_38,0xb0,PVar17);
    PVar17 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this_03);
    DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)pPVar28,'@',PVar17);
    if ((byte)local_7c != '\0') {
      AddBlankFieldAt((PathTypeHandlerBase *)local_38,local_70->pid,(PropertyIndex)local_58,pSVar30)
      ;
    }
    pRVar12 = local_68;
    if (uVar25 == 0x67) {
      (local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasUserDefinedCtor = true;
    }
    if (uVar25 < 0x10) {
      (local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty = true;
    }
    iVar19 = ((((PathTypeHandlerBase *)this_03)->super_DynamicTypeHandler).unusedBytes >> 1) + 1;
    if (iVar19 < pSVar30->maxPathLength) {
      iVar19 = pSVar30->maxPathLength;
    }
    pSVar30->maxPathLength = iVar19;
    local_f0 = (undefined1  [8])&DynamicType::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_9d33d42;
    data.filename._0_4_ = 0x89a;
    alloc = Memory::Recycler::TrackAllocInfo(local_68,(TrackAllocData *)local_f0);
    pPVar23 = (PathTypeHandlerWithAttr *)new<Memory::Recycler>(0x38,alloc,0x38bbb2);
    pPVar28 = local_38;
    pDVar8 = local_a0;
    DynamicType::DynamicType
              ((DynamicType *)pPVar23,local_a0,(DynamicTypeHandler *)local_38,true,bVar13);
    local_40 = pPVar23;
    weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                        (&pRVar12->weakReferenceMap,(char *)pPVar23,pRVar12);
    if (weakRef->typeInfo == (Type)0x0) {
      weakRef->typeInfo = (Type)&DynamicType::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(pRVar12,weakRef);
    }
    pSVar30 = local_90;
    SetSuccessor((PathTypeHandlerBase *)this_03,pDVar8,(PathTypeSuccessorKey)nextTypeWeakRef,
                 (RecyclerWeakReference<Js::DynamicType> *)weakRef,local_90);
    pTVar21 = local_88;
    if ((pPVar28->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 != (ushort)((local_88->data).ptr)->pathLength) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      this_03 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8aa,
                                   "(nextPath->GetPathLength() == newTypePath->GetPathLength())",
                                   "nextPath->GetPathLength() == newTypePath->GetPathLength()");
      if (!bVar13) goto LAB_00dda3bb;
      *puVar20 = 0;
    }
    this = local_78;
    if ((DAT_015d6361 == 1 && (byte)local_7c == '\0') &&
       ((local_38->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
        unusedBytes >> 1 <= (ushort)((pTVar21->data).ptr)->maxInitializedLength)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      this_03 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
      ;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8ac,
                                   "(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength())"
                                   ,
                                   "!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength()"
                                  );
      if (!bVar13) goto LAB_00dda3bb;
      *puVar20 = 0;
    }
    pPVar23 = local_38;
    TraceFixedFieldsAfterTypeHandlerChange
              ((DynamicObject *)this_03,&this->super_DynamicTypeHandler,
               (DynamicTypeHandler *)local_38,pDVar8,(DynamicType *)local_40,
               (RecyclerWeakReference<Js::DynamicObject> *)data._32_8_);
    piVar2 = &pSVar30->promoteCount;
    *piVar2 = *piVar2 + 1;
    piVar2 = &pSVar30->objectLiteralPromoteCount;
    *piVar2 = *piVar2 + 1;
  }
  else {
    bVar13 = PathTypeSuccessorInfo::GetSuccessor
                       (this_00,(PathTypeSuccessorKey)successorKey,&local_b0);
    if ((!bVar13) ||
       (pPVar28 = (PathTypeHandlerWithAttr *)(local_b0->super_RecyclerWeakReferenceBase).strongRef,
       pPVar28 == (PathTypeHandlerWithAttr *)0x0)) goto LAB_00dd981b;
    scriptContext->cacheCount = scriptContext->cacheCount + 1;
    pPVar23 = (PathTypeHandlerWithAttr *)
              (pPVar28->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.successorInfo.ptr;
    local_40 = pPVar28;
    if (((pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
         propertyTypes & 0x40) >> 6 != ((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6)
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8c3,
                                   "(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked())"
                                   ,
                                   "nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked()"
                                  );
      if (!bVar13) goto LAB_00dda3bb;
      *puVar20 = 0;
    }
    iVar19 = (*(pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
               super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])(pPVar23,local_70);
    local_58 = (DynamicObject *)CONCAT44(local_58._4_4_,iVar19);
    if (((DAT_015d6361 != 1) ||
        (((pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
          flags & 8) == 0)) &&
       ((((pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
          flags & 0x10) == 0 ||
        ((local_40->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty ==
         false)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar20 = 1;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                   ,0x8c8,
                                   "((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()))"
                                   ,
                                   "(FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared())"
                                  );
      if (!bVar13) goto LAB_00dda3bb;
      *puVar20 = 0;
    }
    pSVar30 = local_90;
    if ((DAT_015d6361 == 1) &&
       ((local_40->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.hasInternalProperty ==
        false)) {
      if (((pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler
           .flags & 0x10) == 0) {
        AddBlankFieldAt((PathTypeHandlerBase *)pPVar23,local_70->pid,(PropertyIndex)local_58,
                        local_90);
        DoShareTypeHandlerInternal<true>((PathTypeHandlerBase *)pPVar23,pSVar30);
      }
      DynamicType::ShareType((DynamicType *)local_40);
    }
  }
  if ((DAT_015d6345 == 1) &&
     (bVar15 = (this->super_DynamicTypeHandler).flags, (bVar15 & 0x20) != 0 && (bVar15 & 0x18) != 0)
     ) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d5,
                                 "(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype())"
                                 ,
                                 "!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype()"
                                );
    if (!bVar13) goto LAB_00dda3bb;
    *puVar20 = 0;
  }
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)pPVar23,(this->super_DynamicTypeHandler).flags & 0x20);
  bVar15 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  bVar16 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)pPVar23);
  bVar24 = (byte)local_98 & 0x14;
  if ((bVar24 == 4 & (bVar16 ^ bVar15) >> 4) == 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d7,
                                 "(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor))"
                                 ,
                                 "this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor)"
                                );
    if (!bVar13) goto LAB_00dda3bb;
    *puVar20 = 0;
  }
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6 !=
      ((pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
       propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8d8,
                                 "(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked())"
                                 ,
                                 "this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked()"
                                );
    if (!bVar13) goto LAB_00dda3bb;
    *puVar20 = 0;
  }
  PVar17 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)pPVar23,0xa0,PVar17);
  Memory::Recycler::WBSetBit(local_f0);
  local_f0 = (undefined1  [8])&pJVar4->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_f0);
  auVar10 = local_f0;
  if ((bVar24 != 4) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties((DynamicTypeHandler *)pPVar23,false),
     pSVar30 = local_90,
     ((pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
      flags & 0x20) != 0)) {
    propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(local_90,local_70);
    ScriptContext::InvalidateStoreFieldCaches(pSVar30,propertyId);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)auVar10);
  }
  Memory::Recycler::WBSetBit(local_f0);
  local_f0 = (undefined1  [8])&pJVar4->typesWithNoSpecialPropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(local_f0);
  auVar10 = local_f0;
  bVar13 = NoSpecialPropertyCache::IsSpecialProperty(local_70);
  if ((bVar13) &&
     (pTVar1 = &(pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                super_DynamicTypeHandler.propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
      flags & 0x20) != 0)) {
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
              ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)auVar10);
  }
  pPVar28 = local_40;
  *propertyIndex = (PropertyIndex)local_58;
  if ((PathTypeHandlerBase *)
      (((pPVar23->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.predecessorType.ptr)->
      typeHandler).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar20 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                 ,0x8e2,"(nextPath->GetPredecessorType()->GetTypeHandler() == this)"
                                 ,"Promoting this type to a successor with a different predecessor?"
                                );
    if (!bVar13) {
LAB_00dda3bb:
      pcVar9 = (code *)invalidInstructionException();
      (*pcVar9)();
    }
    *puVar20 = 0;
  }
  return (DynamicType *)pPVar28;
}

Assistant:

DynamicType* PathTypeHandlerBase::PromoteType(DynamicType* predecessorType, const PathTypeSuccessorKey key, bool shareType, ScriptContext* scriptContext, DynamicObject* instance, PropertyIndex* propertyIndex)
    {
        Assert(propertyIndex != nullptr);
        Assert(isObjectLiteral || instance != nullptr);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Recycler* recycler = scriptContext->GetRecycler();
        PropertyIndex index;
        DynamicType * nextType;
        RecyclerWeakReference<DynamicType>* nextTypeWeakRef = nullptr;
        const PropertyRecord *propertyRecord = scriptContext->GetPropertyName(key.GetPropertyId());

        PathTypeHandlerBase * nextPath;
        if (!GetSuccessor(key, &nextTypeWeakRef) || (nextType = nextTypeWeakRef->Get()) == nullptr)
        {
            TypePath * newTypePath = GetTypePath();
            uint8 oldPathSize = GetTypePath()->GetPathSize();

            ObjectSlotAttributes *oldAttributes = GetAttributeArray();
            ObjectSlotAttributes *newAttributes = oldAttributes;
            PathTypeSetterSlotIndex *oldSetters = GetSetterSlots();
            PathTypeSetterSlotIndex *newSetters = oldSetters;

            bool branching = GetTypePath()->GetPathLength() > GetPathLength();
            bool growing = !branching && GetTypePath()->GetPathLength() == GetTypePath()->GetPathSize();

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            DynamicType* oldType = predecessorType;
            RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
            TraceFixedFieldsBeforeTypeHandlerChange(branching ? _u("branching") : _u("advancing"), _u("PathTypeHandler"), _u("PathTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif
#endif

            if (branching)
            {
                // We need to branch the type path.

                if (oldSetters)
                {
                    newTypePath = GetTypePath()->Branch<true>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes(), oldAttributes);
                }
                else
                {
                    newTypePath = GetTypePath()->Branch<false>(recycler, GetPathLength(), GetIsOrMayBecomeShared() && !IsolatePrototypes());
                }

#ifdef PROFILE_TYPES
                scriptContext->branchCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
                if (isObjectLiteral)
                {
                    scriptContext->objectLiteralBranchCount++;
                }
#endif

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    Assert(this->HasSingletonInstanceOnlyIfNeeded());
                    this->GetTypePath()->ClearSingletonInstanceIfSame(instance);
                }
#endif
#endif
            }
            else if (growing)
            {
                // We need to grow the type path.

                newTypePath = GetTypePath()->Grow(recycler);

                if (key.GetAttributes() != ObjectSlotAttr_Default || oldAttributes != nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, oldAttributes, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) || oldSetters != nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, oldSetters, oldPathSize, newTypePath->GetPathSize());
                }

                // Update all the predecessor types that use this TypePath to the new TypePath.
                // This will allow the old TypePath to be collected, and will ensure that the
                // fixed field info is correct for those types.

                PathTypeHandlerBase * typeHandlerToUpdate = this;
                TypePath * oldTypePath = GetTypePath();
                while (true)
                {
                    typeHandlerToUpdate->SetTypePath(newTypePath);
                    if (oldAttributes && typeHandlerToUpdate->GetAttributeArray() == oldAttributes)
                    {
                        typeHandlerToUpdate->SetAttributeArray(newAttributes);
                    }
                    if (oldSetters && typeHandlerToUpdate->GetSetterSlots() == oldSetters)
                    {
                        typeHandlerToUpdate->SetSetterSlots(newSetters);
                    }

                    DynamicType * currPredecessorType = typeHandlerToUpdate->GetPredecessorType();
                    if (currPredecessorType == nullptr)
                    {
                        break;
                    }

                    Assert(currPredecessorType->GetTypeHandler()->IsPathTypeHandler());
                    typeHandlerToUpdate = PathTypeHandlerBase::FromTypeHandler(currPredecessorType->GetTypeHandler());
                    if (typeHandlerToUpdate->GetTypePath() != oldTypePath)
                    {
                        break;
                    }
                }
            }
            else
            {
                if (key.GetAttributes() != ObjectSlotAttr_Default && oldAttributes == nullptr)
                {
                    newAttributes = this->UpdateAttributes(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }

                if ((key.GetAttributes() == ObjectSlotAttr_Setter) && oldSetters == nullptr)
                {
                    newSetters = this->UpdateSetterSlots(recycler, nullptr, oldPathSize, newTypePath->GetPathSize());
                }
            }

            bool isSetterProperty = key.GetAttributes() == ObjectSlotAttr_Setter;
            if (isSetterProperty)
            {
                // Not actually adding a property ID to the type path map here.
                index = (PropertyIndex)newTypePath->AddInternal<false>(propertyRecord);
            }
            else
            {
                index = (PropertyIndex)newTypePath->AddInternal<true>(propertyRecord);
            }

            const PropertyIndex newPropertyCount = GetPathLength() + 1;
            const PropertyIndex newSlotCapacity = max(newPropertyCount, static_cast<PropertyIndex>(GetSlotCapacity()));
            PropertyIndex newInlineSlotCapacity = GetInlineSlotCapacity();
            uint16 newOffsetOfInlineSlots = GetOffsetOfInlineSlots();
            if(IsObjectHeaderInlinedTypeHandler() && newSlotCapacity > GetSlotCapacity())
            {
                newInlineSlotCapacity -= GetObjectHeaderInlinableSlotCapacity();
                newOffsetOfInlineSlots = sizeof(DynamicObject);
            }
#if ENABLE_FIXED_FIELDS
            bool markTypeAsShared = !FixPropsOnPathTypes() || shareType;
#else
            bool markTypeAsShared = true;
#endif

            if (key.GetAttributes() == ObjectSlotAttr_Default && oldAttributes == nullptr)
            {
                nextPath = PathTypeHandlerNoAttr::New(scriptContext, newTypePath, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            else
            {
                PathTypeSetterSlotIndex newSetterCount = GetSetterCount() + isSetterProperty;
                newAttributes[index] = key.GetAttributes();
                nextPath = PathTypeHandlerWithAttr::New(scriptContext, newTypePath, newAttributes, newSetters, newSetterCount, newPropertyCount, newSlotCapacity, newInlineSlotCapacity, newOffsetOfInlineSlots, true, markTypeAsShared, predecessorType);
            }
            if (!markTypeAsShared) nextPath->SetMayBecomeShared();
            Assert(nextPath->GetHasOnlyWritableDataProperties());
            nextPath->CopyPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, GetPropertyTypes());
            nextPath->SetPropertyTypes(PropertyTypesInlineSlotCapacityLocked, GetPropertyTypes());

#if ENABLE_FIXED_FIELDS
            if (shareType)
            {
                nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
            }
#endif

            if (key.GetPropertyId() == PropertyIds::constructor)
            {
                nextPath->hasUserDefinedCtor = true;
            }

            if (IsInternalPropertyId(key.GetPropertyId()))
            {
                nextPath->hasInternalProperty = true;
            }

#ifdef PROFILE_TYPES
            scriptContext->maxPathLength = max(GetPathLength() + 1, scriptContext->maxPathLength);
#endif

            if (isObjectLiteral)
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = RecyclerNew(recycler, DynamicType, predecessorType, nextPath, /* isLocked = */ true, /* isShared = */ markTypeAsShared);
            }
            else
            {
                // The new type isn't shared yet.  We will make it shared when the second instance attains it.
                nextType = instance->DuplicateType();
                // nextType's prototype and predecessorType's prototype can only be different here
                // only for SetPrototype scenario where predecessorType is the cachedType with newPrototype
                nextType->SetPrototype(predecessorType->GetPrototype());
                nextType->typeHandler = nextPath;
                markTypeAsShared ? nextType->SetIsLockedAndShared() : nextType->SetIsLocked();
            }

            SetSuccessor(predecessorType, key, recycler->CreateWeakReferenceHandle<DynamicType>(nextType), scriptContext);
            // We just extended the current type path to a new tip or created a brand new type path.  We should
            // be at the tip of the path and there should be no instances there yet.
            Assert(nextPath->GetPathLength() == newTypePath->GetPathLength());
#if ENABLE_FIXED_FIELDS
            Assert(!FixPropsOnPathTypes() || shareType || nextPath->GetPathLength() > newTypePath->GetMaxInitializedLength());
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            TraceFixedFieldsAfterTypeHandlerChange(instance, this, nextPath, oldType, nextType, oldSingletonInstance);
#endif
#endif
#ifdef PROFILE_TYPES
            scriptContext->promoteCount++;
#endif
#ifdef PROFILE_OBJECT_LITERALS
            if (isObjectLiteral)
            {
                scriptContext->objectLiteralPromoteCount++;
            }
#endif
        }
        else
        {
#ifdef PROFILE_TYPES
            scriptContext->cacheCount++;
#endif

            // Now that the second (or subsequent) instance reached this type, make sure that it's shared.
            nextPath = (PathTypeHandlerBase *)nextType->GetTypeHandler();
            Assert(nextPath->GetIsInlineSlotCapacityLocked() == this->GetIsInlineSlotCapacityLocked());

            index = nextPath->GetPropertyIndex(propertyRecord);

#if ENABLE_FIXED_FIELDS
            Assert((FixPropsOnPathTypes() && nextPath->GetMayBecomeShared()) || (nextPath->GetIsShared() && nextType->GetIsShared()));
            if (FixPropsOnPathTypes() && !nextType->GetIsShared())
            {
                if (!nextPath->GetIsShared())
                {
                    nextPath->AddBlankFieldAt(propertyRecord->GetPropertyId(), index, scriptContext);
                    nextPath->DoShareTypeHandlerInternal<true>(scriptContext);
                }
                nextType->ShareType();
            }
#endif
        }

        Assert(!IsolatePrototypes() || !GetIsOrMayBecomeShared() || !GetIsPrototype());
        nextPath->SetFlags(IsPrototypeFlag, this->GetFlags());
        Assert(this->GetHasOnlyWritableDataProperties() == nextPath->GetHasOnlyWritableDataProperties() || !(key.GetAttributes() & ObjectSlotAttr_Writable) || (key.GetAttributes() & ObjectSlotAttr_Accessor));
        Assert(this->GetIsInlineSlotCapacityLocked() == nextPath->GetIsInlineSlotCapacityLocked());
        nextPath->SetPropertyTypes(PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());

        PropertyAttributes isWritableAttribute = ((key.GetAttributes() & ObjectSlotAttr_Writable) && !(key.GetAttributes() & ObjectSlotAttr_Accessor)) ? PropertyWritable : PropertyNone;
        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);
        library->GetTypesWithNoSpecialPropertyProtoChainCache()->ProcessProperty(nextPath, isWritableAttribute, propertyRecord, scriptContext);

        (*propertyIndex) = index;

#if DBG
        AssertMsg(nextPath->GetPredecessorType()->GetTypeHandler() == this, "Promoting this type to a successor with a different predecessor?");
#endif

        return nextType;
    }